

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain
          (DebugInfoManager *this,uint32_t callee_inlined_at,DebugInlinedAtContext *inlined_at_ctx)

{
  uint32_t chain_head_id;
  uint32_t chain_head_id_00;
  uint32_t uVar1;
  CommonDebugInfoInstructions CVar2;
  Instruction *this_00;
  Instruction *insert_before;
  
  chain_head_id = 0;
  if ((inlined_at_ctx->call_inst_scope_).lexical_scope_ != 0) {
    chain_head_id = DebugInlinedAtContext::GetDebugInlinedAtChain(inlined_at_ctx,callee_inlined_at);
    if (chain_head_id == 0) {
      chain_head_id_00 =
           CreateDebugInlinedAt
                     (this,inlined_at_ctx->call_inst_line_,&inlined_at_ctx->call_inst_scope_);
      chain_head_id = 0;
      if (chain_head_id_00 != 0) {
        if (callee_inlined_at == 0) {
          DebugInlinedAtContext::SetDebugInlinedAtChain(inlined_at_ctx,0,chain_head_id_00);
          chain_head_id = chain_head_id_00;
        }
        else {
          insert_before = (Instruction *)0x0;
          uVar1 = callee_inlined_at;
          do {
            this_00 = CloneDebugInlinedAt(this,uVar1,insert_before);
            if (this_00 == (Instruction *)0x0) {
              __assert_fail("new_inlined_at_in_chain != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                            ,0x130,
                            "uint32_t spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain(uint32_t, DebugInlinedAtContext *)"
                           );
            }
            if (chain_head_id == 0) {
              chain_head_id = Instruction::result_id(this_00);
            }
            if (insert_before != (Instruction *)0x0) {
              uVar1 = Instruction::result_id(this_00);
              anon_unknown_0::SetInlinedOperand(insert_before,uVar1);
            }
            CVar2 = Instruction::GetCommonDebugOpcode(this_00);
            if (CVar2 != CommonDebugInfoDebugInlinedAt) {
              __assert_fail("dbg_inlined_at->GetCommonDebugOpcode() == CommonDebugInfoDebugInlinedAt"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                            ,0x43,
                            "uint32_t spvtools::opt::analysis::(anonymous namespace)::GetInlinedOperand(Instruction *)"
                           );
            }
            if ((uint)(((long)(this_00->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 7) break;
            uVar1 = Instruction::GetSingleWordOperand(this_00,6);
            insert_before = this_00;
          } while (uVar1 != 0);
          anon_unknown_0::SetInlinedOperand(this_00,chain_head_id_00);
          DebugInlinedAtContext::SetDebugInlinedAtChain
                    (inlined_at_ctx,callee_inlined_at,chain_head_id);
        }
      }
    }
  }
  return chain_head_id;
}

Assistant:

uint32_t DebugInfoManager::BuildDebugInlinedAtChain(
    uint32_t callee_inlined_at, DebugInlinedAtContext* inlined_at_ctx) {
  if (inlined_at_ctx->GetScopeOfCallInstruction().GetLexicalScope() ==
      kNoDebugScope)
    return kNoInlinedAt;

  // Reuse the already generated DebugInlinedAt chain if exists.
  uint32_t already_generated_chain_head_id =
      inlined_at_ctx->GetDebugInlinedAtChain(callee_inlined_at);
  if (already_generated_chain_head_id != kNoInlinedAt) {
    return already_generated_chain_head_id;
  }

  const uint32_t new_dbg_inlined_at_id =
      CreateDebugInlinedAt(inlined_at_ctx->GetLineOfCallInstruction(),
                           inlined_at_ctx->GetScopeOfCallInstruction());
  if (new_dbg_inlined_at_id == kNoInlinedAt) return kNoInlinedAt;

  if (callee_inlined_at == kNoInlinedAt) {
    inlined_at_ctx->SetDebugInlinedAtChain(kNoInlinedAt, new_dbg_inlined_at_id);
    return new_dbg_inlined_at_id;
  }

  uint32_t chain_head_id = kNoInlinedAt;
  uint32_t chain_iter_id = callee_inlined_at;
  Instruction* last_inlined_at_in_chain = nullptr;
  do {
    Instruction* new_inlined_at_in_chain = CloneDebugInlinedAt(
        chain_iter_id, /* insert_before */ last_inlined_at_in_chain);
    assert(new_inlined_at_in_chain != nullptr);

    // Set DebugInlinedAt of the new scope as the head of the chain.
    if (chain_head_id == kNoInlinedAt)
      chain_head_id = new_inlined_at_in_chain->result_id();

    // Previous DebugInlinedAt of the chain must point to the new
    // DebugInlinedAt as its Inlined operand to build a recursive
    // chain.
    if (last_inlined_at_in_chain != nullptr) {
      SetInlinedOperand(last_inlined_at_in_chain,
                        new_inlined_at_in_chain->result_id());
    }
    last_inlined_at_in_chain = new_inlined_at_in_chain;

    chain_iter_id = GetInlinedOperand(new_inlined_at_in_chain);
  } while (chain_iter_id != kNoInlinedAt);

  // Put |new_dbg_inlined_at_id| into the end of the chain.
  SetInlinedOperand(last_inlined_at_in_chain, new_dbg_inlined_at_id);

  // Keep the new chain information that will be reused it.
  inlined_at_ctx->SetDebugInlinedAtChain(callee_inlined_at, chain_head_id);
  return chain_head_id;
}